

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportInstallFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportInstallFileGenerator *this,string *name,string *config)

{
  char *pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  bool bVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string prop_filename;
  string filename_config;
  string se;
  string fileName;
  string dest;
  string cxx_modules_dirname;
  ostringstream e;
  cmGeneratedFileStream os;
  string local_510;
  long *local_4f0;
  long local_4e8;
  long local_4e0 [2];
  string local_4d0;
  string local_498;
  string local_478;
  string local_458;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_438;
  long *local_430;
  long local_428;
  long local_420 [2];
  undefined1 local_410 [8];
  char *local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined8 local_3e0;
  char *local_3d8;
  undefined8 local_3d0;
  long local_3c8;
  long *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  char *local_3a8;
  undefined8 local_3a0 [33];
  undefined1 local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  undefined8 local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  undefined8 local_270;
  size_type local_268;
  long *local_260;
  undefined8 local_258;
  undefined8 local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  undefined8 local_240;
  long local_238;
  long *local_230;
  undefined8 local_228;
  undefined8 local_220;
  char *local_218;
  undefined8 local_210;
  
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])(&local_430,this);
  if (local_428 == 0) {
    bVar7 = true;
  }
  else {
    local_4f0 = local_4e0;
    pcVar2 = (config->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4f0,pcVar2,pcVar2 + config->_M_string_length);
    if (local_4e8 == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_4f0,0,(char *)0x0,0x7b9c5e);
    }
    local_298._8_8_ = (this->super_cmExportFileGenerator).FileDir._M_dataplus._M_p;
    local_298._0_8_ = (this->super_cmExportFileGenerator).FileDir._M_string_length;
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_410 = (undefined1  [8])0x0;
    local_408 = (char *)0x1;
    local_3f8[0] = 0x2f;
    local_280 = 1;
    local_270 = 0;
    local_268 = local_428;
    local_260 = local_430;
    local_258 = 0;
    pcVar1 = local_4d0.field_2._M_local_buf + 8;
    local_4d0._M_dataplus._M_p = (char *)0x0;
    local_4d0._M_string_length = 1;
    local_4d0.field_2._M_local_buf[8] = '/';
    local_250 = 1;
    local_240 = 0;
    views._M_len = 4;
    views._M_array = (iterator)local_298;
    local_4d0.field_2._M_allocated_capacity = (size_type)pcVar1;
    local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
    local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar1;
    cmCatViews(&local_458,views);
    local_298._0_8_ = local_458._M_string_length;
    local_298._8_8_ = local_458._M_dataplus._M_p;
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_280 = 0xc;
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x800eaf;
    local_270 = 0;
    local_260 = (long *)(name->_M_dataplus)._M_p;
    local_268 = name->_M_string_length;
    local_258 = 0;
    local_410 = (undefined1  [8])0x0;
    local_408 = (char *)0x1;
    local_3f8[0] = 0x2d;
    local_250 = 1;
    local_240 = 0;
    local_238 = local_4e8;
    local_230 = local_4f0;
    local_228 = 0;
    local_220 = 6;
    local_218 = ".cmake";
    local_210 = 0;
    views_00._M_len = 6;
    views_00._M_array = (iterator)local_298;
    local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
    local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
    cmCatViews(&local_478,views_00);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_478,true,None);
    bVar7 = (*(byte *)((long)&local_278 + (long)*(_func_int **)(local_298._0_8_ + -0x18)) & 5) == 0;
    if (bVar7) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ConfigCxxModuleFiles,config);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      local_438 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&this->ConfigCxxModuleTargetFiles,config);
      for (p_Var6 = (this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 !=
          &(this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        this_00 = *(cmGeneratorTarget **)(p_Var6 + 1);
        bVar3 = cmGeneratorTarget::HaveCxx20ModuleSources(this_00,(string *)0x0);
        if (bVar3) {
          cmGeneratorTarget::GetExportName_abi_cxx11_(&local_498,this_00);
          local_410 = (undefined1  [8])0x7;
          local_408 = "target-";
          local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_3f8._0_8_ = local_498._M_string_length;
          local_3f8._8_8_ = local_498._M_dataplus._M_p;
          local_4d0._M_dataplus._M_p = (char *)0x0;
          local_4d0._M_string_length = 1;
          local_4d0.field_2._M_local_buf[8] = '-';
          local_3e0 = 1;
          local_3d0 = 0;
          local_3c8 = local_4e8;
          local_3c0 = local_4f0;
          local_3b8 = 0;
          local_3b0 = 6;
          local_3a8 = ".cmake";
          local_3a0[0] = 0;
          views_01._M_len = 5;
          views_01._M_array = (iterator)local_410;
          local_4d0.field_2._M_allocated_capacity = (size_type)pcVar1;
          local_3e8 = &local_498;
          local_3d8 = pcVar1;
          cmCatViews(&local_510,views_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          local_410 = (undefined1  [8])local_458._M_string_length;
          local_408 = local_458._M_dataplus._M_p;
          local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_3f8._0_8_ = local_510._M_string_length;
          local_3f8._8_8_ = local_510._M_dataplus._M_p;
          local_3e8 = (string *)0x0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_410;
          cmCatViews(&local_4d0,views_02);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_438,&local_4d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,
                            (ulong)(local_4d0.field_2._M_allocated_capacity + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,"include(\"${CMAKE_CURRENT_LIST_DIR}/",0x23);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,local_510._M_dataplus._M_p,
                              local_510._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\")\n",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_410,"cannot write to file \"",0x16);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_410,local_478._M_dataplus._M_p,local_478._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_510);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
      std::ios_base::~ios_base((ios_base *)local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,
                        (ulong)(local_4d0.field_2._M_allocated_capacity + 1));
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    if (local_4f0 != local_4e0) {
      operator_delete(local_4f0,local_4e0[0] + 1);
    }
  }
  if (local_430 != local_420) {
    operator_delete(local_430,local_420[0] + 1);
  }
  return bVar7;
}

Assistant:

bool cmExportInstallFileGenerator::
  GenerateImportCxxModuleConfigTargetInclusion(std::string const& name,
                                               std::string const& config)
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  std::string filename_config = config;
  if (filename_config.empty()) {
    filename_config = "noconfig";
  }

  std::string const dest =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, '/');
  std::string fileName =
    cmStrCat(dest, "cxx-modules-", name, '-', filename_config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  // Record this per-config import file.
  this->ConfigCxxModuleFiles[config] = fileName;

  auto& prop_files = this->ConfigCxxModuleTargetFiles[config];
  for (auto const* tgt : this->ExportedTargets) {
    // Only targets with C++ module sources will have a
    // collator-generated install script.
    if (!tgt->HaveCxx20ModuleSources()) {
      continue;
    }

    auto prop_filename = cmStrCat("target-", tgt->GetExportName(), '-',
                                  filename_config, ".cmake");
    prop_files.emplace_back(cmStrCat(dest, prop_filename));
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << prop_filename << "\")\n";
  }

  return true;
}